

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall pbrt::StatsAccumulator::ReportCounter(StatsAccumulator *this,char *name,int64_t val)

{
  Stats *this_00;
  mapped_type_conflict *pmVar1;
  allocator<char> local_39;
  key_type local_38;
  
  this_00 = this->stats;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&this_00->counters,&local_38);
  *pmVar1 = *pmVar1 + val;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StatsAccumulator::ReportCounter(const char *name, int64_t val) {
    stats->counters[name] += val;
}